

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeContainerFormatParser.cpp
# Opt level: O0

void __thiscall xe::ContainerFormatParser::parseContainerLine(ContainerFormatParser *this)

{
  ContainerElement CVar1;
  bool bVar2;
  int iVar3;
  int local_f4;
  bool local_cd;
  int local_cc;
  bool isEnd;
  int curChar;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  undefined1 local_2d;
  int local_2c;
  bool elemEnd;
  int elemChar;
  int iStack_20;
  bool bufEnd;
  int bufChar;
  int ndx;
  int iStack_14;
  bool isMatch;
  int elemNdx;
  int offset;
  ContainerFormatParser *this_local;
  
  iStack_14 = 1;
  ndx = 0;
  _elemNdx = this;
  do {
    if (5 < ndx) {
LAB_001630ba:
      CVar1 = this->m_element;
      if (1 < CVar1 - CONTAINERELEMENT_BEGIN_SESSION) {
        if (CVar1 == CONTAINERELEMENT_SESSION_INFO) {
          iVar3 = getChar(this,iStack_14);
          if (iVar3 != 0x20) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_88,"Expected attribute name after #sessionInfo",&local_89);
            error(this,&local_88);
            std::__cxx11::string::~string((string *)&local_88);
            std::allocator<char>::~allocator(&local_89);
          }
          iStack_14 = iStack_14 + 1;
          parseContainerValue(this,&this->m_attribute,&stack0xffffffffffffffec);
          iVar3 = getChar(this,iStack_14);
          if (iVar3 != 0x20) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&curChar,"No value for #sessionInfo attribute",
                       (allocator<char> *)&isEnd);
            error(this,(string *)&curChar);
            std::__cxx11::string::~string((string *)&curChar);
            std::allocator<char>::~allocator((allocator<char> *)&isEnd);
          }
          iStack_14 = iStack_14 + 1;
          bVar2 = std::operator==(&this->m_attribute,"timestamp");
          if (bVar2) {
            std::__cxx11::string::clear();
            while( true ) {
              if (iStack_14 < this->m_elementLen) {
                local_f4 = getChar(this,iStack_14);
              }
              else {
                local_f4 = 0;
              }
              bVar2 = true;
              if (((local_f4 != 0) && (bVar2 = true, local_f4 != -1)) &&
                 (bVar2 = true, local_f4 != 10)) {
                bVar2 = local_f4 == 9;
              }
              if (bVar2) break;
              std::__cxx11::string::push_back((char)this + '0');
              iStack_14 = iStack_14 + 1;
            }
          }
          else {
            parseContainerValue(this,&this->m_value,&stack0xffffffffffffffec);
          }
        }
        else {
          if (CVar1 != CONTAINERELEMENT_BEGIN_TEST_CASE_RESULT) {
            if (CVar1 == CONTAINERELEMENT_END_TEST_CASE_RESULT) {
              return;
            }
            if (CVar1 != CONTAINERELEMENT_TERMINATE_TEST_CASE_RESULT) {
              this->m_element = CONTAINERELEMENT_TEST_LOG_DATA;
              return;
            }
          }
          iVar3 = getChar(this,iStack_14);
          if (iVar3 != 0x20) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,"Expected value after instruction",&local_51);
            error(this,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::allocator<char>::~allocator(&local_51);
          }
          iStack_14 = iStack_14 + 1;
          parseContainerValue(this,&this->m_value,&stack0xffffffffffffffec);
        }
      }
      return;
    }
    bufChar._3_1_ = 0;
    iStack_20 = 0;
    while( true ) {
      if (iStack_14 + iStack_20 < this->m_elementLen) {
        local_cc = getChar(this,iStack_14 + iStack_20);
      }
      else {
        local_cc = 0;
      }
      elemChar = local_cc;
      local_cd = true;
      if ((((local_cc != 0) && (local_cd = true, local_cc != 0x20)) &&
          (local_cd = true, local_cc != 0xd)) && (local_cd = true, local_cc != 10)) {
        local_cd = local_cc == -1;
      }
      elemEnd = local_cd;
      local_2c = (int)parseContainerLine::s_elements[ndx].name[iStack_20];
      local_2d = local_2c == 0;
      if ((local_cd != false) || ((bool)local_2d)) break;
      if (local_cc != local_2c) goto LAB_0016307b;
      iStack_20 = iStack_20 + 1;
    }
    bufChar._3_1_ = local_cd == (bool)local_2d;
LAB_0016307b:
    if ((bufChar._3_1_ & 1) != 0) {
      this->m_element = parseContainerLine::s_elements[ndx].element;
      iStack_14 = iStack_20 + iStack_14;
      goto LAB_001630ba;
    }
    ndx = ndx + 1;
  } while( true );
}

Assistant:

void ContainerFormatParser::parseContainerLine (void)
{
	static const struct
	{
		const char*			name;
		ContainerElement	element;
	} s_elements[] =
	{
		{ "beginTestCaseResult",		CONTAINERELEMENT_BEGIN_TEST_CASE_RESULT		},
		{ "endTestCaseResult",			CONTAINERELEMENT_END_TEST_CASE_RESULT		},
		{ "terminateTestCaseResult",	CONTAINERELEMENT_TERMINATE_TEST_CASE_RESULT	},
		{ "sessionInfo",				CONTAINERELEMENT_SESSION_INFO				},
		{ "beginSession",				CONTAINERELEMENT_BEGIN_SESSION				},
		{ "endSession",					CONTAINERELEMENT_END_SESSION				}
	};

	DE_ASSERT(m_elementLen >= 1);
	DE_ASSERT(getChar(0) == '#');

	int offset = 1;

	for (int elemNdx = 0; elemNdx < DE_LENGTH_OF_ARRAY(s_elements); elemNdx++)
	{
		bool	isMatch	= false;
		int		ndx		= 0;

		for (;;)
		{
			int		bufChar		= (offset+ndx < m_elementLen) ? getChar(offset+ndx) : 0;
			bool	bufEnd		= bufChar == 0 || bufChar == ' ' || bufChar == '\r' || bufChar == '\n' || bufChar == (int)END_OF_BUFFER;
			int		elemChar	= s_elements[elemNdx].name[ndx];
			bool	elemEnd		= elemChar == 0;

			if (bufEnd || elemEnd)
			{
				isMatch = bufEnd == elemEnd;
				break;
			}
			else if (bufChar != elemChar)
				break;

			ndx += 1;
		}

		if (isMatch)
		{
			m_element	 = s_elements[elemNdx].element;
			offset		+= ndx;
			break;
		}
	}

	switch (m_element)
	{
		case CONTAINERELEMENT_BEGIN_SESSION:
		case CONTAINERELEMENT_END_SESSION:
		case CONTAINERELEMENT_END_TEST_CASE_RESULT:
			break; // No attribute or value.

		case CONTAINERELEMENT_BEGIN_TEST_CASE_RESULT:
		case CONTAINERELEMENT_TERMINATE_TEST_CASE_RESULT:
			if (getChar(offset) != ' ')
				error("Expected value after instruction");
			offset += 1;
			parseContainerValue(m_value, offset);
			break;

		case CONTAINERELEMENT_SESSION_INFO:
			if (getChar(offset) != ' ')
				error("Expected attribute name after #sessionInfo");
			offset += 1;
			parseContainerValue(m_attribute, offset);
			if (getChar(offset) != ' ')
				error("No value for #sessionInfo attribute");
			offset += 1;

			if (m_attribute == "timestamp")
			{
				m_value.clear();

				// \note Candy produces unescaped timestamps.
				for (;;)
				{
					const int	curChar	= offset < m_elementLen ? getChar(offset) : 0;
					const bool	isEnd	= curChar == 0 || curChar == (int)END_OF_BUFFER || curChar == '\n' || curChar == '\t';

					if (isEnd)
						break;
					else
						m_value.push_back((char)curChar);

					offset += 1;
				}
			}
			else
				parseContainerValue(m_value, offset);
			break;

		default:
			// \todo [2012-06-09 pyry] Implement better way to handle # at the beginning of log lines.
			m_element = CONTAINERELEMENT_TEST_LOG_DATA;
			break;
	}
}